

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

void __thiscall
cppgenerate::Class::printVariables(Class *this,ostream *stream,AccessModifier modifier)

{
  pointer pMVar1;
  AccessModifier AVar2;
  ostream *poVar3;
  bool bVar4;
  pointer other;
  string accessString;
  MemberVariable variable;
  
  accessString._M_dataplus._M_p = (pointer)&accessString.field_2;
  accessString._M_string_length = 0;
  accessString.field_2._M_local_buf[0] = '\0';
  if (modifier < (PROTECTED|PRIVATE)) {
    std::__cxx11::string::assign((char *)&accessString);
  }
  pMVar1 = (this->m_memberVariables).
           super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  for (other = (this->m_memberVariables).
               super__Vector_base<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>
               ._M_impl.super__Vector_impl_data._M_start; other != pMVar1; other = other + 1) {
    MemberVariable::MemberVariable(&variable,other);
    AVar2 = MemberVariable::accessModifier(&variable);
    if (AVar2 == modifier) {
      if (!bVar4) {
        poVar3 = std::operator<<(stream,(string *)&accessString);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      bVar4 = true;
      MemberVariable::print(&variable,stream,4,false);
    }
    MemberVariable::~MemberVariable(&variable);
  }
  std::__cxx11::string::~string((string *)&accessString);
  return;
}

Assistant:

void Class::printVariables( std::ostream& stream, AccessModifier modifier ) const{
    bool havePrinted = false;
    std::string accessString;

    switch( modifier ){
    case cppgenerate::AccessModifier::PRIVATE: accessString = "private:"; break;
    case cppgenerate::AccessModifier::PUBLIC: accessString = "public:"; break;
    case cppgenerate::AccessModifier::PROTECTED: accessString = "protected:"; break;
    }

    for( cppgenerate::MemberVariable variable : m_memberVariables ){
        if( variable.accessModifier() != modifier ) continue;
        if( !havePrinted ){
            stream << accessString << std::endl;
            havePrinted = true;
        }
        variable.print( stream, 4, false );
    }
}